

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O0

void __thiscall JSONValue::~JSONValue(JSONValue *this)

{
  bool bVar1;
  reference ppJVar2;
  reference ppVar3;
  int *in_RDI;
  iterator iter_1;
  iterator iter;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
  *in_stack_ffffffffffffff88;
  wstring *this_00;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
  *in_stack_ffffffffffffff90;
  void *pvVar4;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
  *in_stack_ffffffffffffff98;
  JSONValue *pJVar5;
  vector<JSONValue_*,_std::allocator<JSONValue_*>_> *this_01;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_30;
  JSONValue **local_28;
  JSONValue **local_20;
  JSONValue **local_18;
  __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
  in_stack_fffffffffffffff0;
  iterator this_02;
  
  if (*in_RDI == 4) {
    __gnu_cxx::
    __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>::
    __normal_iterator((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                       *)&stack0xfffffffffffffff0);
    local_18 = (JSONValue **)
               std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                         ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                          in_stack_ffffffffffffff88);
    this_02 = (iterator)local_18;
    while( true ) {
      local_20 = (JSONValue **)
                 std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                           ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                            in_stack_ffffffffffffff88);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff90,
                         (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      ppJVar2 = __gnu_cxx::
                __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                ::operator*((__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                             *)&stack0xfffffffffffffff0);
      pJVar5 = *ppJVar2;
      if (pJVar5 != (JSONValue *)0x0) {
        ~JSONValue((JSONValue *)this_02._M_current);
        operator_delete(pJVar5);
      }
      local_28 = (JSONValue **)
                 __gnu_cxx::
                 __normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                 ::operator++(in_stack_ffffffffffffff98,
                              (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    }
    this_01 = *(vector<JSONValue_*,_std::allocator<JSONValue_*>_> **)(in_RDI + 2);
    if (this_01 != (vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)0x0) {
      std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::~vector(this_01);
      operator_delete(this_01);
    }
  }
  else if (*in_RDI == 5) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
    ::_Rb_tree_iterator(&local_30);
    local_38 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
               ::begin(in_stack_ffffffffffffff88);
    local_30._M_node = local_38;
    while( true ) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
           ::end(in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_30,&local_40);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                            *)0x25ad90);
      pJVar5 = ppVar3->second;
      if (pJVar5 != (JSONValue *)0x0) {
        ~JSONValue((JSONValue *)in_stack_fffffffffffffff0._M_current);
        operator_delete(pJVar5);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                    *)pJVar5,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    }
    pvVar4 = *(void **)(in_RDI + 2);
    if (pvVar4 != (void *)0x0) {
      std::
      map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
      ::~map((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
              *)0x25ade6);
      operator_delete(pvVar4);
    }
  }
  else if ((*in_RDI == 1) && (this_00 = *(wstring **)(in_RDI + 2), this_00 != (wstring *)0x0)) {
    std::__cxx11::wstring::~wstring(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

JSONValue::~JSONValue()
{
	if (type == JSONType_Array)
	{
		JSONArray::iterator iter;
		for (iter = array_value->begin(); iter != array_value->end(); iter++)
			delete *iter;
		delete array_value;
	}
	else if (type == JSONType_Object)
	{
		JSONObject::iterator iter;
		for (iter = object_value->begin(); iter != object_value->end(); iter++)
		{
			delete (*iter).second;
		}
		delete object_value;
	}
	else if (type == JSONType_String)
	{
		delete string_value;
	}
}